

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_matcher.hpp
# Opt level: O3

Path * __thiscall
PathMatcher<int>::create_path
          (PathMatcher<int> *this,
          vector<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_> *parent,
          char character,optional<int> value)

{
  pointer *pppPVar1;
  iterator __position;
  Path *route;
  Path *local_20;
  
  local_20 = (Path *)operator_new(0x28);
  local_20->character = character;
  (local_20->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_20->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_20->children).
  super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_20->result).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_payload_base<int>)
       value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
  __position._M_current =
       (parent->
       super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (parent->
      super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<PathMatcher<int>::Path*,std::allocator<PathMatcher<int>::Path*>>::
    _M_realloc_insert<PathMatcher<int>::Path*const&>
              ((vector<PathMatcher<int>::Path*,std::allocator<PathMatcher<int>::Path*>> *)parent,
               __position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppPVar1 = &(parent->
                super__Vector_base<PathMatcher<int>::Path_*,_std::allocator<PathMatcher<int>::Path_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return local_20;
}

Assistant:

Path *create_path(std::vector<Path *> &parent, char character, std::optional<Result> value) {
        Path *route = new Path(character, value);
        parent.push_back(route);
        return route;
    }